

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall
kj::UnwindDetector::
catchExceptionsIfUnwinding<capnp::InputStreamMessageReader::~InputStreamMessageReader()::__0>
          (UnwindDetector *this,anon_class_8_1_8991fb9c *func)

{
  bool bVar1;
  anon_class_8_1_8991fb9c *func_local;
  UnwindDetector *this_local;
  
  bVar1 = isUnwinding(this);
  if (bVar1) {
    capnp::InputStreamMessageReader::~InputStreamMessageReader::anon_class_8_1_8991fb9c::operator()
              (func);
  }
  else {
    capnp::InputStreamMessageReader::~InputStreamMessageReader::anon_class_8_1_8991fb9c::operator()
              (func);
  }
  return;
}

Assistant:

void UnwindDetector::catchExceptionsIfUnwinding(Func&& func) const {
  if (isUnwinding()) {
    try {
      func();
    } catch (...) {
      catchThrownExceptionAsSecondaryFault();
    }
  } else {
    func();
  }
}